

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# w3.cpp
# Opt level: O2

string * StringFormatVa_abi_cxx11_(string *__return_storage_ptr__,PCSTR format,__va_list_tag *va)

{
  size_t __n;
  vector<char,_std::allocator<char>_> s;
  va_list va2;
  allocator_type local_51;
  _Vector_base<char,_std::allocator<char>_> local_50;
  undefined8 local_38;
  void *pvStack_30;
  void *local_28;
  
  local_28 = va->reg_save_area;
  local_38._0_4_ = va->gp_offset;
  local_38._4_4_ = va->fp_offset;
  pvStack_30 = va->overflow_arg_area;
  __n = string_vformat_length(format,va);
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)&local_50,__n,&local_51);
  vsnprintf(local_50._M_impl.super__Vector_impl_data._M_start,
            (long)local_50._M_impl.super__Vector_impl_data._M_finish -
            (long)local_50._M_impl.super__Vector_impl_data._M_start,format,&local_38);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,local_50._M_impl.super__Vector_impl_data._M_start,
             &local_51);
  std::_Vector_base<char,_std::allocator<char>_>::~_Vector_base(&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string StringFormatVa (PCSTR format, va_list va)
{
    // Some systems, including Linux/amd64, cannot consume a
    // va_list multiple times. It must be copied first.
    // Passing the parameter twice does not work.
#ifndef _WIN32
    va_list va2;
#ifdef __va_copy
    __va_copy (va2, va);
#else
    va_copy (va2, va); // C99
#endif
#endif

    std::vector <char> s (string_vformat_length (format, va));

#ifdef _WIN32
    _vsnprintf (&s [0], s.size (), format, va);
#else
    vsnprintf (&s [0], s.size (), format, va2);
#endif
    return &s [0];
}